

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::UninterpretedOption::SharedDtor(UninterpretedOption *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x255d);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  if ((undefined8 *)(this->identifier_value_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->identifier_value_);
  }
  if ((undefined8 *)(this->string_value_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->string_value_);
  }
  if ((undefined8 *)(this->aggregate_value_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->aggregate_value_);
  }
  return;
}

Assistant:

inline void UninterpretedOption::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  identifier_value_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  string_value_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  aggregate_value_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}